

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

TemplateTokenVector * __thiscall
minja::Parser::tokenize(TemplateTokenVector *__return_storage_ptr__,Parser *this)

{
  char *pcVar1;
  shared_ptr<minja::Expression> *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer pbVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  SpaceHandling SVar8;
  int iVar9;
  long lVar10;
  difference_type dVar11;
  runtime_error *prVar12;
  char *pcVar13;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__lhs;
  SpaceHandling pre_space_2;
  shared_ptr<minja::VariableExpr> macroname;
  shared_ptr<minja::Expression> expr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  bool recursive;
  SpaceHandling pre_space;
  undefined4 uStack_12c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128 [3];
  SpaceHandling post_space_9;
  SpaceHandling post_space;
  undefined4 uStack_104;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  group;
  anon_class_16_2_ee9a8eb6 parseBlockClose;
  SpaceHandling post_space_7;
  undefined4 uStack_b4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  value_type content;
  smatch match;
  string text;
  Location location;
  
  if ((tokenize()::comment_tok_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&tokenize()::comment_tok_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::comment_tok_abi_cxx11_,"\\{#([-~]?)([\\s\\S]*?)([-~]?)#\\}",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::comment_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::comment_tok_abi_cxx11_);
  }
  if ((tokenize()::expr_open_regex_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&tokenize()::expr_open_regex_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::expr_open_regex_abi_cxx11_,"\\{\\{([-~])?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::expr_open_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::expr_open_regex_abi_cxx11_);
  }
  if ((tokenize()::block_open_regex_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&tokenize()::block_open_regex_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::block_open_regex_abi_cxx11_,"^\\{%([-~])?\\s*",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::block_open_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::block_open_regex_abi_cxx11_);
  }
  if ((tokenize()::block_keyword_tok_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&tokenize()::block_keyword_tok_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::block_keyword_tok_abi_cxx11_,
               "(if|else|elif|endif|for|endfor|generation|endgeneration|set|endset|block|endblock|macro|endmacro|filter|endfilter|break|continue)\\b"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::block_keyword_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::block_keyword_tok_abi_cxx11_);
  }
  if ((tokenize()::non_text_open_regex_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&tokenize()::non_text_open_regex_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::non_text_open_regex_abi_cxx11_,"\\{\\{|\\{%|\\{#",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::non_text_open_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::non_text_open_regex_abi_cxx11_);
  }
  if ((tokenize()::expr_close_regex_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&tokenize()::expr_close_regex_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::expr_close_regex_abi_cxx11_,"\\s*([-~])?\\}\\}",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::expr_close_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::expr_close_regex_abi_cxx11_);
  }
  if ((tokenize()::block_close_regex_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&tokenize()::block_close_regex_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::block_close_regex_abi_cxx11_,"\\s*([-~])?%\\}",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::block_close_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::block_close_regex_abi_cxx11_);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  group.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  group.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  group.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if ((this->it)._M_current == (this->end)._M_current) {
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&match);
      std::__cxx11::string::~string((string *)&text);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&group);
      return __return_storage_ptr__;
    }
    get_location(&location,this);
    consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&content,this,&tokenize()::comment_tok_abi_cxx11_,Keep);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&group,&content);
    pbVar5 = group.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = group.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&content);
    if (pbVar4 != pbVar5) {
      SVar8 = parsePreSpace(this,group.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
      pre_space = SVar8;
      std::__cxx11::string::string
                ((string *)&content,
                 (string *)
                 (group.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2));
      SVar8 = parsePostSpace(this,group.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 3);
      post_space = SVar8;
      std::
      make_unique<minja::CommentTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::__cxx11::string&>
                ((Location *)&macroname,(SpaceHandling *)&location,&pre_space,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&post_space);
      expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Expression;
      macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::
      vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
      ::
      emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                 &expr);
      if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (*(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_Expression[1])();
      }
      expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (*((macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_Expression)._vptr_Expression[1])();
      }
      goto LAB_001ad4a8;
    }
    consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&content,this,&tokenize()::expr_open_regex_abi_cxx11_,Keep);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&group,&content);
    pbVar5 = group.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = group.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&content);
    bVar7 = SUB81(this,0);
    if (pbVar4 == pbVar5) {
      consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&content,this,&tokenize()::block_open_regex_abi_cxx11_,Keep);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&group,&content);
      pbVar5 = group.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = group.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&content);
      if (pbVar4 == pbVar5) {
        bVar7 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(this->it)._M_current,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(this->end)._M_current,&match,
                           &tokenize()::non_text_open_regex_abi_cxx11_,0);
        if (bVar7) {
          dVar11 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::position(&match,0);
          if (dVar11 == 0) {
            __lhs = match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            if ((long)match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x48) {
              __lhs = match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -3;
            }
            if (match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              __lhs = match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -3;
            }
            bVar7 = std::__cxx11::operator!=(__lhs,"{#");
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            if (bVar7) {
              std::runtime_error::runtime_error(prVar12,"Internal error: Expected a comment");
            }
            else {
              std::runtime_error::runtime_error(prVar12,"Missing end of comment tag");
            }
            __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          dVar11 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::position(&match,0);
          pcVar1 = (this->it)._M_current;
          pcVar13 = pcVar1 + dVar11;
          content._M_dataplus._M_p = (pointer)&content.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&content,pcVar1,pcVar13);
          std::__cxx11::string::operator=((string *)&text,(string *)&content);
          std::__cxx11::string::~string((string *)&content);
          (this->it)._M_current = pcVar13;
          macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               ((ulong)macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr & 0xffffffff00000000);
          _pre_space = _pre_space & 0xffffffff00000000;
          std::
          make_unique<minja::TextTemplateToken,minja::Location&,minja::SpaceHandling,minja::SpaceHandling,std::__cxx11::string&>
                    ((Location *)&expr,(SpaceHandling *)&location,(SpaceHandling *)&macroname,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pre_space
                    );
          content._M_dataplus._M_p =
               (pointer)expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::
          vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
          ::
          emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                    ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                      *)__return_storage_ptr__,
                     (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *
                     )&content);
        }
        else {
          content._M_dataplus._M_p = (pointer)&content.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&content,(this->it)._M_current,(this->end)._M_current);
          std::__cxx11::string::operator=((string *)&text,(string *)&content);
          std::__cxx11::string::~string((string *)&content);
          (this->it)._M_current = (this->end)._M_current;
          macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               ((ulong)macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr & 0xffffffff00000000);
          _pre_space = _pre_space & 0xffffffff00000000;
          std::
          make_unique<minja::TextTemplateToken,minja::Location&,minja::SpaceHandling,minja::SpaceHandling,std::__cxx11::string&>
                    ((Location *)&expr,(SpaceHandling *)&location,(SpaceHandling *)&macroname,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pre_space
                    );
          content._M_dataplus._M_p =
               (pointer)expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::
          vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
          ::
          emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                    ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                      *)__return_storage_ptr__,
                     (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *
                     )&content);
        }
        if (content._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)content._M_dataplus._M_p + 8))();
        }
        content._M_dataplus._M_p = (pointer)0x0;
        if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          (*(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Expression[1])();
        }
      }
      else {
        pre_space_2 = parsePreSpace(this,group.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1);
        content._M_dataplus._M_p = (pointer)&content.field_2;
        content._M_string_length = 0;
        content.field_2._M_local_buf[0] = '\0';
        parseBlockClose.group = &group;
        parseBlockClose.this = this;
        consumeToken((string *)&expr,this,&tokenize()::block_keyword_tok_abi_cxx11_,Strip);
        lVar10 = std::__cxx11::string::operator=((string *)&content,(string *)&expr);
        lVar10 = *(long *)(lVar10 + 8);
        std::__cxx11::string::~string((string *)&expr);
        if (lVar10 == 0) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar12,"Expected block keyword");
          __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar6 = std::operator==(&content,"if");
        if (bVar6) {
          parseExpression((Parser *)&expr,bVar7);
          if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar12,"Expected condition in if block");
            __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
          post_space = SVar8;
          std::
          make_unique<minja::IfTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::Expression>>
                    ((Location *)&pre_space,(SpaceHandling *)&location,&pre_space_2,
                     (shared_ptr<minja::Expression> *)&post_space);
          macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_pre_space;
          _pre_space = (pointer)0x0;
          std::
          vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
          ::
          emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                    ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                      *)__return_storage_ptr__,
                     (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *
                     )&macroname);
          if (macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) {
            (*((macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->super_Expression)._vptr_Expression[1])();
          }
          macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if ((element_type *)_pre_space != (element_type *)0x0) {
            (**(code **)(*(long *)_pre_space + 8))();
          }
LAB_001ad937:
          psVar2 = &expr;
LAB_001ad93c:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&(psVar2->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
        }
        else {
          bVar6 = std::operator==(&content,"elif");
          if (bVar6) {
            parseExpression((Parser *)&expr,bVar7);
            if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar12,"Expected condition in elif block");
              __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
            post_space = SVar8;
            std::
            make_unique<minja::ElifTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::Expression>>
                      ((Location *)&pre_space,(SpaceHandling *)&location,&pre_space_2,
                       (shared_ptr<minja::Expression> *)&post_space);
            macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)_pre_space;
            _pre_space = (pointer)0x0;
            std::
            vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
            ::
            emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                      ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                        *)__return_storage_ptr__,
                       (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)&macroname);
            if (macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)0x0) {
              (*((macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_Expression)._vptr_Expression[1])();
            }
            macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if ((element_type *)_pre_space != (element_type *)0x0) {
              (**(code **)(*(long *)_pre_space + 8))();
            }
            goto LAB_001ad937;
          }
          bVar6 = std::operator==(&content,"else");
          if (!bVar6) {
            bVar6 = std::operator==(&content,"endif");
            if (bVar6) {
              SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
              pre_space = SVar8;
              std::
              make_unique<minja::EndIfTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                        ((Location *)&macroname,(SpaceHandling *)&location,&pre_space_2);
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &(macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_Expression;
              macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::
              vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
              ::
              emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                        ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                          *)__return_storage_ptr__,
                         (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)&expr);
              goto LAB_001adac9;
            }
            bVar6 = std::operator==(&content,"for");
            if (bVar6) {
              if ((tokenize()::recursive_tok_abi_cxx11_ == '\0') &&
                 (iVar9 = __cxa_guard_acquire(&tokenize()::recursive_tok_abi_cxx11_), iVar9 != 0)) {
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          (&tokenize()::recursive_tok_abi_cxx11_,"recursive\\b",0x10);
                __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                             ~basic_regex,&tokenize()::recursive_tok_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&tokenize()::recursive_tok_abi_cxx11_);
              }
              if ((tokenize()::if_tok_abi_cxx11_ == '\0') &&
                 (iVar9 = __cxa_guard_acquire(&tokenize()::if_tok_abi_cxx11_), iVar9 != 0)) {
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          (&tokenize()::if_tok_abi_cxx11_,"if\\b",0x10);
                __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                             ~basic_regex,&tokenize()::if_tok_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&tokenize()::if_tok_abi_cxx11_);
              }
              parseVarNames_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&macroname,this);
              if ((tokenize()::in_tok_abi_cxx11_ == '\0') &&
                 (iVar9 = __cxa_guard_acquire(&tokenize()::in_tok_abi_cxx11_), iVar9 != 0)) {
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          (&tokenize()::in_tok_abi_cxx11_,"in\\b",0x10);
                __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                             ~basic_regex,&tokenize()::in_tok_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&tokenize()::in_tok_abi_cxx11_);
              }
              consumeToken((string *)&expr,this,&tokenize()::in_tok_abi_cxx11_,Strip);
              _Var3 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
              std::__cxx11::string::~string((string *)&expr);
              if (_Var3._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar12,"Expected \'in\' keyword in for block");
                __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              parseExpression((Parser *)&pre_space,bVar7);
              if ((element_type *)_pre_space == (element_type *)0x0) {
                prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar12,"Expected iterable in for block");
                __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              _post_space = (pointer)0x0;
              _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              consumeToken((string *)&expr,this,&tokenize()::if_tok_abi_cxx11_,Strip);
              _Var3 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
              std::__cxx11::string::~string((string *)&expr);
              if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                parseExpression((Parser *)&expr,bVar7);
                std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *)
                           &post_space,
                           (__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *)&expr);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              consumeToken((string *)&expr,this,&tokenize()::recursive_tok_abi_cxx11_,Strip);
              _Var3 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
              std::__cxx11::string::~string((string *)&expr);
              recursive = _Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              post_space_9 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
              std::
              make_unique<minja::ForTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,bool&>
                        ((Location *)&post_space_7,(SpaceHandling *)&location,&pre_space_2,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&post_space_9,(shared_ptr<minja::Expression> *)&macroname,
                         (shared_ptr<minja::Expression> *)&pre_space,(bool *)&post_space);
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &_post_space_7->super_Expression;
              _post_space_7 = (element_type *)0x0;
              std::
              vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
              ::
              emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                        ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                          *)__return_storage_ptr__,
                         (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)&expr);
              if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                (*(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_Expression[1])();
              }
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              if (_post_space_7 != (element_type *)0x0) {
                (*(_post_space_7->super_Expression)._vptr_Expression[1])();
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_100);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_128);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&macroname);
              goto LAB_001ad4a8;
            }
            bVar6 = std::operator==(&content,"endfor");
            if (bVar6) {
              SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
              pre_space = SVar8;
              std::
              make_unique<minja::EndForTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                        ((Location *)&macroname,(SpaceHandling *)&location,&pre_space_2);
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &(macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_Expression;
              macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::
              vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
              ::
              emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                        ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                          *)__return_storage_ptr__,
                         (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)&expr);
              goto LAB_001adac9;
            }
            bVar6 = std::operator==(&content,"generation");
            if (bVar6) {
              SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
              pre_space = SVar8;
              std::
              make_unique<minja::GenerationTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                        ((Location *)&macroname,(SpaceHandling *)&location,&pre_space_2);
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &(macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_Expression;
              macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::
              vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
              ::
              emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                        ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                          *)__return_storage_ptr__,
                         (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)&expr);
              goto LAB_001adac9;
            }
            bVar6 = std::operator==(&content,"endgeneration");
            if (bVar6) {
              SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
              pre_space = SVar8;
              std::
              make_unique<minja::EndGenerationTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                        ((Location *)&macroname,(SpaceHandling *)&location,&pre_space_2);
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &(macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_Expression;
              macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::
              vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
              ::
              emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                        ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                          *)__return_storage_ptr__,
                         (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)&expr);
              goto LAB_001adac9;
            }
            bVar6 = std::operator==(&content,"set");
            if (bVar6) {
              if ((tokenize()::namespaced_var_regex_abi_cxx11_ == '\0') &&
                 (iVar9 = __cxa_guard_acquire(&tokenize()::namespaced_var_regex_abi_cxx11_),
                 iVar9 != 0)) {
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          (&tokenize()::namespaced_var_regex_abi_cxx11_,"(\\w+)\\s*\\.\\s*(\\w+)",
                           0x10);
                __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                             ~basic_regex,&tokenize()::namespaced_var_regex_abi_cxx11_,&__dso_handle
                            );
                __cxa_guard_release(&tokenize()::namespaced_var_regex_abi_cxx11_);
              }
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_148;
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_148._M_local_buf[0] = '\0';
              _post_space = (pointer)0x0;
              _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_f8._M_allocated_capacity = 0;
              _post_space_7 = (element_type *)0x0;
              _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&macroname,this,&tokenize()::namespaced_var_regex_abi_cxx11_,
                                 Strip);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign(&group,(string *)&macroname);
              pbVar5 = group.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pbVar4 = group.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&macroname);
              if (pbVar4 == pbVar5) {
                parseVarNames_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&macroname,this);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&post_space,(string *)&macroname);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&macroname);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&pre_space,"=",(allocator<char> *)&post_space_9);
                consumeToken((string *)&macroname,this,(string *)&pre_space,Strip);
                _Var3 = macroname.
                        super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
                std::__cxx11::string::~string((string *)&macroname);
                std::__cxx11::string::~string((string *)&pre_space);
                if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  parseExpression((Parser *)&macroname,bVar7);
                  std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *)
                             &post_space_7,
                             (__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *)
                             &macroname);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&macroname.
                              super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  if (_post_space_7 == (element_type *)0x0) {
                    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar12,"Expected value in set block");
                    goto LAB_001aea81;
                  }
                }
              }
              else {
                std::__cxx11::string::_M_assign((string *)&expr);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&post_space,
                            group.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 2);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&pre_space,"=",(allocator<char> *)&post_space_9);
                consumeToken((string *)&macroname,this,(string *)&pre_space,Strip);
                _Var3 = macroname.
                        super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
                std::__cxx11::string::~string((string *)&macroname);
                std::__cxx11::string::~string((string *)&pre_space);
                if (_Var3._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar12,"Expected equals sign in set block");
LAB_001aea81:
                  __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                parseExpression((Parser *)&macroname,bVar7);
                std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *)
                           &post_space_7,
                           (__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *)&macroname
                          );
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&macroname.
                            super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (_post_space_7 == (element_type *)0x0) {
                  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar12,"Expected value in set block");
                  goto LAB_001aea81;
                }
              }
              post_space_9 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
              std::
              make_unique<minja::SetTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::shared_ptr<minja::Expression>>
                        ((Location *)&pre_space,(SpaceHandling *)&location,&pre_space_2,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &post_space_9,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&expr,(shared_ptr<minja::Expression> *)&post_space);
              macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)_pre_space;
              _pre_space = (pointer)0x0;
              std::
              vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
              ::
              emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                        ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                          *)__return_storage_ptr__,
                         (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)&macroname);
              if (macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                (*((macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Expression)._vptr_Expression[1])();
              }
              macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              if ((element_type *)_pre_space != (element_type *)0x0) {
                (**(code **)(*(long *)_pre_space + 8))();
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&post_space);
              std::__cxx11::string::~string((string *)&expr);
              goto LAB_001ad4a8;
            }
            bVar6 = std::operator==(&content,"endset");
            if (bVar6) {
              SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
              pre_space = SVar8;
              std::
              make_unique<minja::EndSetTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                        ((Location *)&macroname,(SpaceHandling *)&location,&pre_space_2);
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &(macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_Expression;
              macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::
              vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
              ::
              emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                        ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                          *)__return_storage_ptr__,
                         (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)&expr);
              goto LAB_001adac9;
            }
            bVar6 = std::operator==(&content,"macro");
            if (!bVar6) {
              bVar6 = std::operator==(&content,"endmacro");
              if (bVar6) {
                SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                pre_space = SVar8;
                std::
                make_unique<minja::EndMacroTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                          ((Location *)&macroname,(SpaceHandling *)&location,&pre_space_2);
                expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     &(macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_Expression;
                macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)0x0;
                std::
                vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                ::
                emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                          ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                            *)__return_storage_ptr__,
                           (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)&expr);
              }
              else {
                bVar6 = std::operator==(&content,"filter");
                if (bVar6) {
                  parseExpression((Parser *)&expr,bVar7);
                  if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar12,"Expected expression in filter block")
                    ;
                    __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                  post_space = SVar8;
                  std::
                  make_unique<minja::FilterTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::Expression>>
                            ((Location *)&pre_space,(SpaceHandling *)&location,&pre_space_2,
                             (shared_ptr<minja::Expression> *)&post_space);
                  macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)_pre_space;
                  _pre_space = (pointer)0x0;
                  std::
                  vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                  ::
                  emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                            ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                              *)__return_storage_ptr__,
                             (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)&macroname);
                  if (macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr != (element_type *)0x0) {
                    (*((macroname.
                        super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Expression)._vptr_Expression[1])();
                  }
                  macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  if ((element_type *)_pre_space != (element_type *)0x0) {
                    (**(code **)(*(long *)_pre_space + 8))();
                  }
                  goto LAB_001ad937;
                }
                bVar7 = std::operator==(&content,"endfilter");
                if (bVar7) {
                  SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                  pre_space = SVar8;
                  std::
                  make_unique<minja::EndFilterTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                            ((Location *)&macroname,(SpaceHandling *)&location,&pre_space_2);
                  expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       &(macroname.
                         super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->super_Expression;
                  macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  std::
                  vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                  ::
                  emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                            ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                              *)__return_storage_ptr__,
                             (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)&expr);
                }
                else {
                  bVar7 = std::operator==(&content,"break");
                  if ((!bVar7) && (bVar7 = std::operator==(&content,"continue"), !bVar7)) {
                    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&expr,"Unexpected block: ",&content);
                    std::runtime_error::runtime_error(prVar12,(string *)&expr);
                    __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                  pre_space = SVar8;
                  bVar7 = std::operator==(&content,"break");
                  post_space = (uint)!bVar7;
                  std::
                  make_unique<minja::LoopControlTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,minja::LoopControlType>
                            ((Location *)&macroname,(SpaceHandling *)&location,&pre_space_2,
                             &pre_space);
                  expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       &(macroname.
                         super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->super_Expression;
                  macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  std::
                  vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                  ::
                  emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                            ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                              *)__return_storage_ptr__,
                             (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)&expr);
                }
              }
              goto LAB_001adac9;
            }
            parseIdentifier((Parser *)&macroname);
            if (macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                == (element_type *)0x0) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar12,"Expected macro name in macro block");
              __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            parseParameters_abi_cxx11_((Parameters *)&expr,this);
            SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
            _post_space_7 = (element_type *)CONCAT44(uStack_b4,SVar8);
            std::
            make_unique<minja::MacroTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::VariableExpr>,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>>
                      ((Location *)&post_space,(SpaceHandling *)&location,&pre_space_2,
                       (shared_ptr<minja::VariableExpr> *)&post_space_7,
                       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                        *)&macroname);
            _pre_space = _post_space;
            _post_space = (pointer)0x0;
            std::
            vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
            ::
            emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                      ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                        *)__return_storage_ptr__,
                       (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)&pre_space);
            if ((element_type *)_pre_space != (element_type *)0x0) {
              (**(code **)(*(long *)_pre_space + 8))();
            }
            _pre_space = (pointer)0x0;
            if ((long *)_post_space != (long *)0x0) {
              (**(code **)(*(long *)_post_space + 8))();
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                       *)&expr);
            psVar2 = (shared_ptr<minja::Expression> *)&macroname;
            goto LAB_001ad93c;
          }
          SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
          pre_space = SVar8;
          std::
          make_unique<minja::ElseTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                    ((Location *)&macroname,(SpaceHandling *)&location,&pre_space_2);
          expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &(macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->super_Expression;
          macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::
          vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
          ::
          emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                    ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                      *)__return_storage_ptr__,
                     (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *
                     )&expr);
LAB_001adac9:
          if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            (*(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Expression[1])();
          }
          expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if (macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) {
            (*((macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->super_Expression)._vptr_Expression[1])();
          }
        }
LAB_001ad4a8:
        std::__cxx11::string::~string((string *)&content);
      }
    }
    else {
      SVar8 = parsePreSpace(this,group.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
      pre_space = SVar8;
      parseExpression((Parser *)&expr,bVar7);
      consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&content,this,&tokenize()::expr_close_regex_abi_cxx11_,Strip);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&group,&content);
      pbVar5 = group.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = group.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&content);
      if (pbVar4 == pbVar5) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,"Expected closing expression tag");
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      SVar8 = parsePostSpace(this,group.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
      post_space = SVar8;
      std::
      make_unique<minja::ExpressionTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::Expression>>
                ((Location *)&macroname,(SpaceHandling *)&location,&pre_space,
                 (shared_ptr<minja::Expression> *)&post_space);
      content._M_dataplus._M_p =
           (pointer)macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::
      vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
      ::
      emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                ((vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                 &content);
      if (content._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)content._M_dataplus._M_p + 8))();
      }
      content._M_dataplus._M_p = (pointer)0x0;
      if (macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (*((macroname.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_Expression)._vptr_Expression[1])();
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&location.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  } while( true );
}

Assistant:

TemplateTokenVector tokenize() {
      static std::regex comment_tok(R"(\{#([-~]?)([\s\S]*?)([-~]?)#\})");
      static std::regex expr_open_regex(R"(\{\{([-~])?)");
      static std::regex block_open_regex(R"(^\{%([-~])?\s*)");
      static std::regex block_keyword_tok(R"((if|else|elif|endif|for|endfor|generation|endgeneration|set|endset|block|endblock|macro|endmacro|filter|endfilter|break|continue)\b)");
      static std::regex non_text_open_regex(R"(\{\{|\{%|\{#)");
      static std::regex expr_close_regex(R"(\s*([-~])?\}\})");
      static std::regex block_close_regex(R"(\s*([-~])?%\})");

      TemplateTokenVector tokens;
      std::vector<std::string> group;
      std::string text;
      std::smatch match;

      try {
        while (it != end) {
          auto location = get_location();

          if (!(group = consumeTokenGroups(comment_tok, SpaceHandling::Keep)).empty()) {
            auto pre_space = parsePreSpace(group[1]);
            auto content = group[2];
            auto post_space = parsePostSpace(group[3]);
            tokens.push_back(std::make_unique<CommentTemplateToken>(location, pre_space, post_space, content));
          } else if (!(group = consumeTokenGroups(expr_open_regex, SpaceHandling::Keep)).empty()) {
            auto pre_space = parsePreSpace(group[1]);
            auto expr = parseExpression();

            if ((group = consumeTokenGroups(expr_close_regex)).empty()) {
              throw std::runtime_error("Expected closing expression tag");
            }

            auto post_space = parsePostSpace(group[1]);
            tokens.push_back(std::make_unique<ExpressionTemplateToken>(location, pre_space, post_space, std::move(expr)));
          } else if (!(group = consumeTokenGroups(block_open_regex, SpaceHandling::Keep)).empty()) {
            auto pre_space = parsePreSpace(group[1]);

            std::string keyword;

            auto parseBlockClose = [&]() -> SpaceHandling {
              if ((group = consumeTokenGroups(block_close_regex)).empty()) throw std::runtime_error("Expected closing block tag");
              return parsePostSpace(group[1]);
            };

            if ((keyword = consumeToken(block_keyword_tok)).empty()) throw std::runtime_error("Expected block keyword");

            if (keyword == "if") {
              auto condition = parseExpression();
              if (!condition) throw std::runtime_error("Expected condition in if block");

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<IfTemplateToken>(location, pre_space, post_space, std::move(condition)));
            } else if (keyword == "elif") {
              auto condition = parseExpression();
              if (!condition) throw std::runtime_error("Expected condition in elif block");

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<ElifTemplateToken>(location, pre_space, post_space, std::move(condition)));
            } else if (keyword == "else") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<ElseTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "endif") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndIfTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "for") {
              static std::regex recursive_tok(R"(recursive\b)");
              static std::regex if_tok(R"(if\b)");

              auto varnames = parseVarNames();
              static std::regex in_tok(R"(in\b)");
              if (consumeToken(in_tok).empty()) throw std::runtime_error("Expected 'in' keyword in for block");
              auto iterable = parseExpression(/* allow_if_expr = */ false);
              if (!iterable) throw std::runtime_error("Expected iterable in for block");

              std::shared_ptr<Expression> condition;
              if (!consumeToken(if_tok).empty()) {
                condition = parseExpression();
              }
              auto recursive = !consumeToken(recursive_tok).empty();

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<ForTemplateToken>(location, pre_space, post_space, std::move(varnames), std::move(iterable), std::move(condition), recursive));
            } else if (keyword == "endfor") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndForTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "generation") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<GenerationTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "endgeneration") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndGenerationTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "set") {
              static std::regex namespaced_var_regex(R"((\w+)\s*\.\s*(\w+))");

              std::string ns;
              std::vector<std::string> var_names;
              std::shared_ptr<Expression> value;
              if (!(group = consumeTokenGroups(namespaced_var_regex)).empty()) {
                ns = group[1];
                var_names.push_back(group[2]);

                if (consumeToken("=").empty()) throw std::runtime_error("Expected equals sign in set block");

                value = parseExpression();
                if (!value) throw std::runtime_error("Expected value in set block");
              } else {
                var_names = parseVarNames();

                if (!consumeToken("=").empty()) {
                  value = parseExpression();
                  if (!value) throw std::runtime_error("Expected value in set block");
                }
              }
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<SetTemplateToken>(location, pre_space, post_space, ns, var_names, std::move(value)));
            } else if (keyword == "endset") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndSetTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "macro") {
              auto macroname = parseIdentifier();
              if (!macroname) throw std::runtime_error("Expected macro name in macro block");
              auto params = parseParameters();

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<MacroTemplateToken>(location, pre_space, post_space, std::move(macroname), std::move(params)));
            } else if (keyword == "endmacro") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndMacroTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "filter") {
              auto filter = parseExpression();
              if (!filter) throw std::runtime_error("Expected expression in filter block");

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<FilterTemplateToken>(location, pre_space, post_space, std::move(filter)));
            } else if (keyword == "endfilter") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndFilterTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "break" || keyword == "continue") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<LoopControlTemplateToken>(location, pre_space, post_space, keyword == "break" ? LoopControlType::Break : LoopControlType::Continue));
            } else {
              throw std::runtime_error("Unexpected block: " + keyword);
            }
          } else if (std::regex_search(it, end, match, non_text_open_regex)) {
            if (!match.position()) {
                if (match[0] != "{#")
                    throw std::runtime_error("Internal error: Expected a comment");
                throw std::runtime_error("Missing end of comment tag");
            }
            auto text_end = it + match.position();
            text = std::string(it, text_end);
            it = text_end;
            tokens.push_back(std::make_unique<TextTemplateToken>(location, SpaceHandling::Keep, SpaceHandling::Keep, text));
          } else {
            text = std::string(it, end);
            it = end;
            tokens.push_back(std::make_unique<TextTemplateToken>(location, SpaceHandling::Keep, SpaceHandling::Keep, text));
          }
        }
        return tokens;
      } catch (const std::exception & e) {
        throw std::runtime_error(e.what() + error_location_suffix(*template_str, std::distance(start, it)));
      }
    }